

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O3

void arkStep_ApplyForcing(ARKodeARKStepMem step_mem,realtype t,realtype s,int *nvec)

{
  long lVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  iVar2 = *nvec;
  step_mem->cvals[iVar2] = s;
  step_mem->Xvecs[iVar2] = *step_mem->forcing;
  *nvec = iVar2 + 1;
  if (1 < step_mem->nforcing) {
    dVar4 = (t - step_mem->tshift) / step_mem->tscale;
    lVar1 = (long)(iVar2 + 1);
    iVar2 = iVar2 + 2;
    lVar3 = 1;
    dVar5 = dVar4;
    do {
      step_mem->cvals[lVar1] = dVar5 * s;
      step_mem->Xvecs[lVar1] = step_mem->forcing[lVar3];
      *nvec = iVar2;
      lVar3 = lVar3 + 1;
      lVar1 = lVar1 + 1;
      iVar2 = iVar2 + 1;
      dVar5 = dVar4 * dVar5;
    } while (lVar3 < step_mem->nforcing);
  }
  return;
}

Assistant:

void arkStep_ApplyForcing(ARKodeARKStepMem step_mem, realtype t,
                          realtype s, int *nvec)
{
  realtype tau, taui;
  int i;

  /* always append the constant forcing term */
  step_mem->cvals[*nvec] = s;
  step_mem->Xvecs[*nvec] = step_mem->forcing[0];
  (*nvec) += 1;

  /* compute normalized time tau and initialize tau^i */
  tau  = (t - step_mem->tshift) / (step_mem->tscale);
  taui = tau;
  for (i=1; i<step_mem->nforcing; i++) {
    step_mem->cvals[*nvec] = s*taui;
    step_mem->Xvecs[*nvec] = step_mem->forcing[i];
    taui *= tau;
    (*nvec) += 1;
  }
}